

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAsyncTaskManager.hpp
# Opt level: O0

void __thiscall sftm::CAsyncTaskManager::Start(CAsyncTaskManager *this,uint32_t nInitWorkers)

{
  reference pvVar1;
  uint local_18;
  uint local_14;
  uint32_t nWorker;
  uint32_t nInitWorkers_local;
  CAsyncTaskManager *this_local;
  
  local_14 = nInitWorkers;
  if (0x40 < nInitWorkers) {
    local_14 = 0x3f;
  }
  this->m_nWorkerCount = local_14;
  for (local_18 = 0; local_18 < local_14; local_18 = local_18 + 1) {
    pvVar1 = std::array<sftm::CAsyncWorker,_64UL>::operator[](&this->m_workers,(ulong)local_18);
    (pvVar1->m_ownerData).m_pCvWorkerIdle = &this->m_cvWorkerIdle;
    pvVar1 = std::array<sftm::CAsyncWorker,_64UL>::operator[](&this->m_workers,(ulong)local_18);
    (pvVar1->m_ownerData).m_pMutWorkerIdle = &this->m_mtxWorkerIdle;
    pvVar1 = std::array<sftm::CAsyncWorker,_64UL>::operator[](&this->m_workers,(ulong)local_18);
    (pvVar1->m_ownerData).m_pTaskQueue = &this->m_taskQueue;
    pvVar1 = std::array<sftm::CAsyncWorker,_64UL>::operator[](&this->m_workers,(ulong)local_18);
    CAsyncWorker::Start(pvVar1);
  }
  return;
}

Assistant:

void Start(std::uint32_t nInitWorkers = 1) noexcept
		{
			if (nInitWorkers > MAX_WORKERS)
				nInitWorkers = MAX_WORKERS - 1;
			m_nWorkerCount = nInitWorkers;

			for (std::uint32_t nWorker = 0; nWorker < nInitWorkers; nWorker++)
			{
				m_workers[nWorker].m_ownerData.m_pCvWorkerIdle	= &m_cvWorkerIdle;
				m_workers[nWorker].m_ownerData.m_pMutWorkerIdle = &m_mtxWorkerIdle;
				m_workers[nWorker].m_ownerData.m_pTaskQueue		= &m_taskQueue;

				m_workers[nWorker].Start();
			}
		}